

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O2

void TasGrid::OneDimensionalNodes::getGaussJacobi
               (int m,vector<double,_std::allocator<double>_> *w,
               vector<double,_std::allocator<double>_> *x,double alpha,double beta)

{
  undefined1 auVar1 [16];
  double dVar2;
  size_type sVar3;
  size_type __n;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  allocator_type local_e9;
  double local_e8;
  double local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  vector<double,_std::allocator<double>_> off_diag;
  vector<double,_std::allocator<double>_> diag;
  
  local_c8._8_4_ = in_XMM0_Dc;
  local_c8._0_8_ = alpha;
  local_c8._12_4_ = in_XMM0_Dd;
  local_b8._8_4_ = in_XMM0_Dc;
  local_b8._0_8_ = alpha + beta;
  local_b8._12_4_ = in_XMM0_Dd;
  local_d8 = ZEXT816(0x3ff0000000000000);
  local_e8 = beta;
  local_e0 = exp2(alpha + beta + 1.0);
  uVar4 = local_d8._12_4_;
  local_d8._8_4_ = local_d8._8_4_;
  local_d8._0_8_ = local_d8._0_8_ + local_e8;
  local_d8._12_4_ = uVar4;
  dVar7 = (double)local_c8._0_8_ + 1.0;
  auVar1._8_4_ = SUB84((double)local_b8._0_8_ + 2.0,0);
  auVar1._0_8_ = dVar7;
  auVar1._12_4_ = (int)((ulong)((double)local_b8._0_8_ + 2.0) >> 0x20);
  dVar8 = tgamma(dVar7);
  dVar2 = tgamma((double)local_d8._0_8_);
  dVar6 = auVar1._8_8_;
  dVar5 = tgamma(dVar6);
  ::std::vector<double,_std::allocator<double>_>::vector(&diag,(long)m,(allocator_type *)&off_diag);
  __n = (size_type)(m + -1);
  ::std::vector<double,_std::allocator<double>_>::vector(&off_diag,__n,&local_e9);
  dVar5 = (local_e0 * dVar8 * dVar2) / dVar5;
  *diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (local_e8 - (double)local_c8._0_8_) / dVar6;
  if (1 < m) {
    dVar6 = ((double)local_d8._0_8_ * dVar7 * 4.0) /
            (dVar6 * ((double)local_b8._0_8_ + 3.0) * dVar6);
    local_e0 = dVar5;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
      dVar7 = (double)local_c8._0_8_;
    }
    else {
      dVar6 = SQRT(dVar6);
      dVar7 = (double)local_c8._0_8_;
    }
    *off_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = dVar6;
    dVar8 = local_e8 * local_e8 - dVar7 * dVar7;
    local_d8._0_8_ = dVar8;
    sVar3 = 1;
    dVar6 = local_e8;
    while (__n != sVar3) {
      dVar2 = (double)(int)(sVar3 + 1);
      dVar5 = dVar2 + dVar2 + (double)local_b8._0_8_;
      diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar3] = dVar8 / ((dVar5 + -2.0) * dVar5);
      dVar2 = ((dVar2 + dVar6) * (dVar2 + dVar7) * dVar2 * 4.0 * ((double)local_b8._0_8_ + dVar2)) /
              ((dVar5 * dVar5 + -1.0) * dVar5 * dVar5);
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
        dVar6 = local_e8;
        dVar7 = (double)local_c8._0_8_;
        dVar8 = (double)local_d8._0_8_;
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      off_diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar3] = dVar2;
      sVar3 = sVar3 + 1;
    }
    dVar6 = (double)m + (double)m + (double)local_b8._0_8_;
    diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[__n] = dVar8 / ((dVar6 + -2.0) * dVar6);
    dVar5 = local_e0;
  }
  TasmanianTridiagonalSolver::decompose(&diag,&off_diag,dVar5,x,w);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&off_diag.super__Vector_base<double,_std::allocator<double>_>);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&diag.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void OneDimensionalNodes::getGaussJacobi(int m, std::vector<double> &w, std::vector<double> &x, double alpha, double beta){
    double ab = alpha + beta;
    double mu0 = pow(2.0, 1.0 + ab) * tgamma(alpha + 1.0) * tgamma(beta + 1.0) / tgamma(2.0 + ab);
    std::vector<double> diag(m), off_diag(m-1);
    diag[0] = (beta - alpha) / (2.0 + ab);
    if (m > 1) {
        off_diag[0] =  std::sqrt(4.0 * (1.0 + alpha) * (1.0 + beta) / ((3.0 + ab) * (2.0 + ab) * (2.0 + ab)));
        for(int i=1; i<m-1; i++){
            double di = (double) (i+1);
            diag[i] =  (beta * beta - alpha * alpha) / ((2.0 * di + ab -2.0) * (2.0 * di + ab));
            off_diag[i] = std::sqrt(4.0 * di * (di + alpha) * (di + beta) * (di + ab) /
                                    (((2.0 * di + ab) * (2.0 * di + ab) - 1.0) * (2.0 * di + ab) * (2.0 * di + ab)));
        }
        double dm = (double) m;
        diag[m-1] = (beta * beta - alpha * alpha) / ((2.0 * dm + ab - 2.0) * (2.0 * dm + ab));;
    }
    TasmanianTridiagonalSolver::decompose(diag, off_diag, mu0, x, w);
}